

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O0

void __thiscall
QMessageBox::QMessageBox
          (QMessageBox *this,Icon icon,QString *title,QString *text,StandardButtons buttons,
          QWidget *parent,WindowFlags f)

{
  long lVar1;
  bool bVar2;
  void *pvVar3;
  QMessageBoxPrivate *this_00;
  QDialogPrivate *in_RCX;
  EVP_PKEY_CTX *in_RDX;
  QFlagsStorage<Qt::WindowType> in_ESI;
  undefined8 *in_RDI;
  QWidget *in_R9;
  long in_FS_OFFSET;
  QMessageBoxPrivate *d;
  WindowType other;
  QMessageBoxPrivate *in_stack_ffffffffffffff90;
  QFlagsStorage<QMessageBox::StandardButton> lhs;
  QWidget *parent_00;
  QFlagsStorage<QMessageBox::StandardButton> buttons_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar3 = operator_new(0x3b0);
  other = (WindowType)((ulong)pvVar3 >> 0x20);
  QMessageBoxPrivate::QMessageBoxPrivate(in_stack_ffffffffffffff90);
  parent_00 = in_R9;
  QFlags<Qt::WindowType>::operator|((QFlags<Qt::WindowType> *)in_R9,other);
  QFlags<Qt::WindowType>::operator|((QFlags<Qt::WindowType> *)in_R9,other);
  QFlags<Qt::WindowType>::operator|((QFlags<Qt::WindowType> *)in_R9,other);
  QFlags<Qt::WindowType>::operator|((QFlags<Qt::WindowType> *)in_R9,other);
  QDialog::QDialog((QDialog *)in_RDX,in_RCX,parent_00,(WindowFlags)in_ESI.i);
  buttons_00.i = (Int)((ulong)in_RCX >> 0x20);
  *in_RDI = &PTR_metaObject_00d254a8;
  in_RDI[2] = &PTR__QMessageBox_00d25680;
  this_00 = d_func((QMessageBox *)0x7a4874);
  lhs.i = (Int)((ulong)in_RDI >> 0x20);
  QMessageBoxPrivate::init(this_00,in_RDX);
  setIcon((QMessageBox *)this_00,lhs.i);
  bVar2 = ::operator!=((QFlags<QMessageBox::StandardButton>)lhs.i,(StandardButton)in_R9);
  if (bVar2) {
    setStandardButtons((QMessageBox *)in_R9,(StandardButtons)buttons_00.i);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QMessageBox::QMessageBox(Icon icon, const QString &title, const QString &text,
                         StandardButtons buttons, QWidget *parent,
                         Qt::WindowFlags f)
: QDialog(*new QMessageBoxPrivate, parent, f | Qt::MSWindowsFixedSizeDialogHint | Qt::WindowTitleHint | Qt::WindowSystemMenuHint | Qt::WindowCloseButtonHint)
{
    Q_D(QMessageBox);
    d->init(title, text);
    setIcon(icon);
    if (buttons != NoButton)
        setStandardButtons(buttons);
}